

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

void __thiscall ChebTools::LMatrixLibrary::build(LMatrixLibrary *this,size_t N)

{
  bool bVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  ActualDstType actualDst;
  mapped_type *dst;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  MatrixXd L;
  assign_op<double,_double> local_89;
  size_t local_88;
  int local_80;
  int local_7c;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  double local_58;
  ulong local_50;
  longdouble local_48;
  longdouble local_3c;
  
  uVar5 = N + 1;
  local_78.m_data = (double *)0x0;
  local_78.m_rows = 0;
  local_78.m_cols = 0;
  local_88 = N;
  if ((long)uVar5 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((uVar5 != 0) &&
     (auVar2._8_8_ = 0, auVar2._0_8_ = uVar5,
     auVar11 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar11 / auVar2,0) < (long)uVar5)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8,N,SUB168(auVar11 % auVar2,0));
    *puVar4 = std::random_device::_M_fini;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_78,uVar5 * uVar5,uVar5,uVar5);
  lVar7 = 0;
  local_48 = _DAT_001a6940;
  uVar5 = 0;
  do {
    if (uVar5 <= local_88) {
      local_7c = (int)uVar5;
      local_3c = local_48 * (longdouble)local_7c;
      uVar6 = uVar5;
      do {
        sVar3 = local_88;
        local_80 = (int)uVar6;
        local_50 = local_88;
        local_58 = (double)((local_3c * (longdouble)local_80) /
                           ((longdouble)(long)local_88 +
                           (longdouble)*(float *)(&DAT_001a68c0 + (ulong)((long)local_88 < 0) * 4)))
        ;
        dVar8 = cos(local_58);
        if ((local_78.m_rows <= (long)uVar5) || (local_78.m_cols <= (long)uVar6)) {
LAB_00137dbd:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                       );
        }
        dVar10 = 2.0;
        if (sVar3 != uVar5) {
          dVar10 = 1.0;
        }
        dVar9 = 2.0;
        if (uVar5 != 0) {
          dVar9 = dVar10;
        }
        dVar10 = 2.0;
        if (uVar6 != sVar3) {
          dVar10 = 1.0;
        }
        dVar12 = 2.0;
        if (uVar6 != 0) {
          dVar12 = dVar10;
        }
        auVar11._8_4_ = (int)(sVar3 >> 0x20);
        auVar11._0_8_ = sVar3;
        auVar11._12_4_ = 0x45300000;
        dVar8 = (2.0 / (((auVar11._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) *
                       dVar9 * dVar12)) * dVar8;
        local_78.m_data[local_78.m_rows * uVar6 + uVar5] = dVar8;
        if ((local_78.m_rows <= (long)uVar6) || (local_78.m_cols <= (long)uVar5)) goto LAB_00137dbd;
        *(double *)((long)local_78.m_data + uVar6 * 8 + local_78.m_rows * lVar7) = dVar8;
        bVar1 = uVar6 < local_88;
        uVar6 = uVar6 + 1;
      } while (bVar1);
    }
    lVar7 = lVar7 + 8;
    bVar1 = local_88 <= uVar5;
    uVar5 = uVar5 + 1;
    if (bVar1) {
      dst = std::
            map<unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::operator[](&this->matrices,&local_88);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (dst,(Matrix<double,__1,__1,_0,__1,__1> *)&local_78,&local_89);
      free(local_78.m_data);
      return;
    }
  } while( true );
}

Assistant:

void build(std::size_t N) {
            Eigen::MatrixXd L(N + 1, N + 1); ///< Matrix of coefficients
            for (int j = 0; j <= N; ++j) {
                for (int k = j; k <= N; ++k) {
                    double p_j = (j == 0 || j == N) ? 2 : 1;
                    double p_k = (k == 0 || k == N) ? 2 : 1;
                    L(j, k) = 2.0 / (p_j*p_k*N)*cos((j*EIGEN_PI*k) / N);
                    // Exploit symmetry to fill in the symmetric elements in the matrix
                    L(k, j) = L(j, k);
                }
            }
            matrices[N] = L;
        }